

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

wchar_t cmp_level(void *a,void *b)

{
  wchar_t wVar1;
  
  wVar1 = L'\xffffffff';
  if (r_info[*b].level <= r_info[*a].level) {
    if (r_info[*b].level < r_info[*a].level) {
      return L'\x01';
    }
    if ((r_info[*b].mexp <= r_info[*a].mexp) &&
       (wVar1 = L'\x01', r_info[*a].mexp <= r_info[*b].mexp)) {
      wVar1 = L'\xffffffff';
      if (b <= a) {
        wVar1 = (wchar_t)(b < a);
      }
      return wVar1;
    }
  }
  return wVar1;
}

Assistant:

static int cmp_level(const void *a, const void *b)
{
	uint16_t ia = *(const uint16_t *)a;
	uint16_t ib = *(const uint16_t *)b;
	if (r_info[ia].level < r_info[ib].level)
		return -1;
	if (r_info[ia].level > r_info[ib].level)
		return 1;
	return cmp_mexp(a, b);
}